

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flash.c
# Opt level: O0

void complete_flash_command(gbamem_t *mem,gbabus_t *bus)

{
  int iVar1;
  long in_RDI;
  
  iVar1 = *(int *)(in_RDI + 0x4803c);
  if (iVar1 == 0xaa5510) {
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/flash.c"
            ,0x5d);
    fprintf(_stderr,
            "FLASHC_ERASE_ENTIRE_CHIP should be handled by the state machine below, as it is a subcommand.\n\x1b[0;m"
           );
    exit(1);
  }
  if (iVar1 == 0xaa5580) {
    *(undefined4 *)(in_RDI + 0x48038) = 4;
  }
  else if (iVar1 == 0xaa5590) {
    *(undefined4 *)(in_RDI + 0x48038) = 3;
  }
  else if (iVar1 == 0xaa55a0) {
    if (atmel) {
      *(undefined4 *)(in_RDI + 0x48038) = 7;
    }
    else {
      *(undefined4 *)(in_RDI + 0x48038) = 8;
    }
  }
  else if (iVar1 == 0xaa55b0) {
    *(undefined4 *)(in_RDI + 0x48038) = 9;
  }
  else {
    if (iVar1 != 0xaa55f0) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/flash.c"
              ,0x5f);
      fprintf(_stderr,"Unimplemented flash command: 0x%06X\n\x1b[0;m",
              (ulong)*(uint *)(in_RDI + 0x4803c));
      exit(1);
    }
    *(undefined4 *)(in_RDI + 0x48038) = 0;
  }
  return;
}

Assistant:

void complete_flash_command(gbamem_t* mem, gbabus_t* bus) {
    switch (mem->flash_command) {
        case FLASHC_CHIP_ID:
#ifdef FLASH_VERBOSE_LOG
            printf("FLASHC_CHIP_ID\n");
#endif
            mem->flash_state = FLASH_CHIP_ID;
            break;
        case FLASHC_EXIT_CHIP_ID:
#ifdef FLASH_VERBOSE_LOG
            printf("FLASHC_EXIT_CHIP_ID\n");
#endif
            mem->flash_state = FLASH_READY;
            break;
        case FLASHC_BANKSWITCH:
#ifdef FLASH_VERBOSE_LOG
            printf("FLASHC_BANKSWITCH\n");
#endif
            mem->flash_state = FLASH_BANKSWITCH;
            break;
        case FLASHC_ERASE:
#ifdef FLASH_VERBOSE_LOG
            printf("FLASHC_ERASE\n");
#endif
            mem->flash_state = FLASH_ERASE;
            break;
        case FLASHC_WRITE_DATA:
            if (atmel) {
#ifdef FLASH_VERBOSE_LOG
                printf("FLASH_ERASE_WRITE_SECTOR\n");
#endif
                mem->flash_state = FLASH_ERASE_WRITE_SECTOR;
            } else {
#ifdef FLASH_VERBOSE_LOG
                printf("FLASH_WRITE_SINGLE_BYTE\n");
#endif
                mem->flash_state = FLASH_WRITE_SINGLE_BYTE;
            }
            break;
        case FLASHC_ERASE_ENTIRE_CHIP:
            logfatal("FLASHC_ERASE_ENTIRE_CHIP should be handled by the state machine below, as it is a subcommand.")
        default:
            logfatal("Unimplemented flash command: 0x%06X", mem->flash_command)
    }
}